

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_fourier_transform.cc
# Opt level: O1

void __thiscall
sptk::FastFourierTransform::FastFourierTransform
          (FastFourierTransform *this,int num_order,int fft_length)

{
  int iVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  
  this->_vptr_FastFourierTransform = (_func_int **)&PTR__FastFourierTransform_00113c38;
  this->num_order_ = num_order;
  this->fft_length_ = fft_length;
  this->half_fft_length_ = fft_length / 2;
  this->is_valid_ = true;
  (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (num_order < fft_length && -1 < num_order) {
    bVar3 = IsPowerOfTwo(fft_length);
    if (bVar3) {
      iVar1 = this->fft_length_;
      iVar4 = iVar1 + 3;
      if (-1 < iVar1) {
        iVar4 = iVar1;
      }
      iVar6 = iVar1 - (iVar4 >> 2);
      std::vector<double,_std::allocator<double>_>::resize(&this->sine_table_,(long)(iVar6 + 1));
      if (-1 < iVar6) {
        uVar5 = 0;
        do {
          dVar2 = sin((double)(int)uVar5 *
                      (3.141592653589793 / (double)iVar1 + 3.141592653589793 / (double)iVar1));
          (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5] = dVar2;
          uVar5 = uVar5 + 1;
        } while ((iVar1 - (iVar4 >> 2)) + 1 != uVar5);
      }
      (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[this->fft_length_ / 2] = 0.0;
      return;
    }
  }
  this->is_valid_ = false;
  return;
}

Assistant:

FastFourierTransform::FastFourierTransform(int num_order, int fft_length)
    : num_order_(num_order),
      fft_length_(fft_length),
      half_fft_length_(fft_length_ / 2),
      is_valid_(true) {
  if (num_order_ < 0 || fft_length_ <= num_order_ ||
      !sptk::IsPowerOfTwo(fft_length_)) {
    is_valid_ = false;
    return;
  }

  const int table_size(fft_length_ - fft_length_ / 4 + 1);
  const double argument(sptk::kPi / fft_length_ * 2);
  sine_table_.resize(table_size);
  for (int i(0); i < table_size; ++i) {
    sine_table_[i] = std::sin(argument * i);
  }
  sine_table_[fft_length_ / 2] = 0.0;
}